

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  char *pcVar1;
  CURLcode error;
  char *pcVar2;
  CURLcode res;
  _Bool cleanup_local;
  Curl_easy *data_local;
  
  if ((data->set).str[5] == (char *)0x0) {
    if ((cleanup) && ((data->state).cookielist != (curl_slist *)0x0)) {
      curl_slist_free_all((data->state).cookielist);
      (data->state).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  }
  else {
    if ((data->state).cookielist != (curl_slist *)0x0) {
      Curl_cookie_loadfiles(data);
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    error = cookie_output(data,data->cookies,(data->set).str[5]);
    if (error != CURLE_OK) {
      pcVar1 = (data->set).str[5];
      pcVar2 = curl_easy_strerror(error);
      Curl_infof(data,"WARNING: failed to save cookies in %s: %s",pcVar1,pcVar2);
    }
  }
  if ((cleanup) && ((data->share == (Curl_share *)0x0 || (data->cookies != data->share->cookies))))
  {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = (CookieInfo *)0x0;
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  CURLcode res;

  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->state.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    res = cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]);
    if(res)
      infof(data, "WARNING: failed to save cookies in %s: %s",
            data->set.str[STRING_COOKIEJAR], curl_easy_strerror(res));
  }
  else {
    if(cleanup && data->state.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->state.cookielist); /* clean up list */
      data->state.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}